

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O3

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::MultAddMT
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  undefined8 *puVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  complex<double> *pcVar4;
  long *plVar5;
  TPZFMatrix<std::complex<double>_> *pTVar6;
  double dVar7;
  long lVar8;
  long *plVar9;
  double dVar10;
  long lVar11;
  long lVar12;
  complex<double> *pcVar13;
  long lVar14;
  char *pcVar15;
  size_t __n;
  long lVar16;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  complex<double> aval;
  double local_c8;
  double dStack_c0;
  double local_b8;
  TPZFMatrix<std::complex<double>_> *local_b0;
  TPZFMatrix<std::complex<double>_> *local_a8;
  int local_9c;
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  long local_68;
  double local_60;
  double local_58;
  int64_t local_50;
  complex<double> local_48;
  
  local_60 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  lVar11 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  local_b0 = y;
  if (((lVar11 == (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) &&
      (lVar11 == (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) &&
     ((y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow ==
      (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
    local_88 = ZEXT816(0);
    local_50 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
    local_9c = alpha._M_value._0_4_;
    local_98 = (double)local_50;
    if (local_9c != 0) {
      local_98 = (double)(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    }
    if (0 < lVar11) {
      __n = (long)local_98 << 4;
      lVar12 = 0;
      local_b8 = in_XMM3_Qa;
      local_a8 = x;
      local_78 = in_XMM2_Qa;
      local_68 = lVar11;
      local_58 = in_XMM1_Qa;
      do {
        lVar11 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if ((lVar11 < 1) ||
           ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar12)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = z->fElem;
        dVar10 = cabs(local_78);
        if (1e-12 <= ABS(dVar10)) {
          if (z != local_b0) {
            memcpy(pcVar4 + lVar11 * lVar12,local_b0->fElem,__n);
          }
        }
        else {
          if (((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow < 1) ||
             ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (local_98 != 0.0) {
            memset(z->fElem,0,__n);
          }
        }
        lVar12 = lVar12 + 1;
      } while (local_68 != lVar12);
      if (local_9c == 0 && local_68 == 1) {
        if (((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
             (local_a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) ||
           ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
            (local_b0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
          pcVar15 = 
          "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n";
          lVar11 = 0x4f;
          goto LAB_00d6967b;
        }
        if (0 < local_50) {
          lVar11 = 0;
          do {
            plVar9 = (this->fIA).fStore;
            plVar5 = (this->fJA).fStore;
            lVar12 = plVar9[lVar11];
            lVar14 = plVar9[lVar11 + 1];
            pcVar4 = local_a8->fElem;
            local_88 = ZEXT816(0);
            local_b8 = (double)lVar11;
            if (lVar12 < lVar14) {
              pcVar13 = (this->fA).fStore + lVar12;
              do {
                local_c8 = *(double *)pcVar13->_M_value;
                dStack_c0 = *(double *)(pcVar13->_M_value + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_c8,pcVar4 + plVar5[lVar12]);
                dStack_c0 = dStack_c0 + (double)local_88._8_8_;
                local_88._8_4_ = SUB84(dStack_c0,0);
                local_88._0_8_ = local_c8 + (double)local_88._0_8_;
                local_88._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
                lVar12 = lVar12 + 1;
                pcVar13 = pcVar13 + 1;
              } while (lVar14 != lVar12);
            }
            local_c8 = local_60;
            dStack_c0 = local_58;
            std::complex<double>::operator*=
                      ((complex<double> *)&local_c8,(complex<double> *)local_88);
            if (((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                 (long)local_b8) ||
               ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
              local_78 = local_c8;
              dStack_70 = dStack_c0;
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = (long)local_b8 + 1;
            pcVar4 = z->fElem + (long)local_b8;
            dVar10 = *(double *)(pcVar4->_M_value + 8);
            pcVar13 = z->fElem + (long)local_b8;
            *(double *)pcVar13->_M_value = local_c8 + *(double *)pcVar4->_M_value;
            *(double *)(pcVar13->_M_value + 8) = dStack_c0 + dVar10;
          } while ((double)lVar11 != local_98);
        }
      }
      else if (0 < local_68) {
        lVar11 = 0;
        do {
          lVar12 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          if (local_9c == 0) {
            if (0 < lVar12) {
              dVar10 = 0.0;
              do {
                pTVar6 = local_a8;
                local_88 = ZEXT816(0);
                plVar9 = (this->fIA).fStore;
                lVar12 = plVar9[(long)dVar10];
                dVar7 = (double)((long)dVar10 + 1);
                local_78 = dVar10;
                if (lVar12 < plVar9[(long)dVar10 + 1]) {
                  lVar14 = lVar12 << 4;
                  local_b8 = (double)((long)dVar10 + 1);
                  do {
                    pdVar2 = (double *)(((this->fA).fStore)->_M_value + lVar14);
                    local_c8 = *pdVar2;
                    dStack_c0 = pdVar2[1];
                    std::complex<double>::operator*=
                              ((complex<double> *)&local_c8,
                               pTVar6->fElem +
                               (pTVar6->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               fRow * lVar11 + (this->fJA).fStore[lVar12]);
                    dStack_c0 = dStack_c0 + (double)local_88._8_8_;
                    local_88._8_4_ = SUB84(dStack_c0,0);
                    local_88._0_8_ = local_c8 + (double)local_88._0_8_;
                    local_88._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
                    lVar12 = lVar12 + 1;
                    lVar14 = lVar14 + 0x10;
                    dVar7 = local_b8;
                  } while (lVar12 < (this->fIA).fStore[(long)local_b8]);
                }
                dVar10 = dVar7;
                local_c8 = local_60;
                dStack_c0 = local_58;
                std::complex<double>::operator*=
                          ((complex<double> *)&local_c8,(complex<double> *)local_88);
                lVar12 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
                if ((lVar12 <= (long)local_78) ||
                   ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar11))
                {
                  local_98 = local_c8;
                  dStack_90 = dStack_c0;
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = lVar12 * lVar11;
                auVar3 = *(undefined1 (*) [16])z->fElem[lVar12 + (long)local_78]._M_value;
                pcVar4 = z->fElem + lVar12 + (long)local_78;
                *(double *)pcVar4->_M_value = local_c8 + auVar3._0_8_;
                *(double *)(pcVar4->_M_value + 8) = dStack_c0 + auVar3._8_8_;
              } while ((long)dVar10 <
                       (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow);
            }
          }
          else {
            if ((lVar12 != (local_a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                           fRow) ||
               ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
                (local_b0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n"
                         ,0x4e);
              return;
            }
            if (0 < lVar12) {
              plVar9 = (this->fIA).fStore;
              local_b8 = 0.0;
              do {
                lVar14 = plVar9[(long)local_b8];
                dVar10 = (double)((long)local_b8 + 1);
                if (lVar14 < plVar9[(long)local_b8 + 1]) {
                  lVar12 = (this->fJA).fStore[lVar14];
                  local_78 = local_b8;
                  if (lVar12 != -1) {
                    lVar16 = lVar14 << 4;
                    do {
                      local_b8 = dVar10;
                      lVar14 = lVar14 + 1;
                      puVar1 = (undefined8 *)(((this->fA).fStore)->_M_value + lVar16);
                      local_48._M_value._0_8_ = *puVar1;
                      local_48._M_value._8_8_ = puVar1[1];
                      local_c8 = local_60;
                      dStack_c0 = local_58;
                      std::complex<double>::operator*=((complex<double> *)&local_c8,&local_48);
                      std::complex<double>::operator*=
                                ((complex<double> *)&local_c8,
                                 local_a8->fElem +
                                 (local_a8->super_TPZMatrix<std::complex<double>_>).
                                 super_TPZBaseMatrix.fRow * lVar11 + (long)local_78);
                      if (((lVar12 < 0) ||
                          (lVar8 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                                   fRow, lVar8 <= lVar12)) ||
                         ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                          lVar11)) {
                        local_98 = local_c8;
                        dStack_90 = dStack_c0;
                        TPZFMatrix<std::complex<double>_>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      lVar8 = lVar8 * lVar11;
                      auVar3 = *(undefined1 (*) [16])z->fElem[lVar8 + lVar12]._M_value;
                      pcVar4 = z->fElem + lVar8 + lVar12;
                      *(double *)pcVar4->_M_value = local_c8 + auVar3._0_8_;
                      *(double *)(pcVar4->_M_value + 8) = dStack_c0 + auVar3._8_8_;
                      plVar9 = (this->fIA).fStore;
                      dVar10 = local_b8;
                      if (plVar9[(long)local_b8] <= lVar14) break;
                      lVar12 = (this->fJA).fStore[lVar14];
                      lVar16 = lVar16 + 0x10;
                    } while (lVar12 != -1);
                  }
                  local_b8 = dVar10;
                  lVar12 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
                  dVar10 = local_b8;
                }
                local_b8 = dVar10;
              } while ((long)local_b8 < lVar12);
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_68);
      }
    }
    return;
  }
  pcVar15 = "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n";
  lVar11 = 0x53;
LAB_00d6967b:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,lVar11);
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::MultAddMT(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y,
									 TPZFMatrix<TVar> &z,
									 const TVar alpha,const TVar beta,const int opt )  {
	// computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot share storage
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || y.Rows() != z.Rows() )
	{
		cout << "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n";
		return;
	}
	
	int64_t  ir, ic, icol, xcols;
	xcols = x.Cols();
	TVar sum;
	int64_t  r = (opt) ? this->Cols() : this->Rows();
	
	// Determine how to initialize z
	for(ic=0; ic<xcols; ic++) {
		TVar *zp = &(z(0,ic));
		if(!IsZero(beta)){
			const TVar *yp = &(y.g(0,0));
			TVar *zlast = zp+r;

            if(&z != &y) {
				memcpy(zp,yp,r*sizeof(TVar));
			}
		} else {
			TVar *zp = &(z(0,0)), *zlast = zp+r;
			while(zp != zlast) {
				*zp = 0.;
				zp ++;
			}
		}
	}
	// Compute alpha * A * x
	if(xcols == 1 && opt == 0)
	{
		if(this->Cols() != x.Rows() || this->Rows() != y.Rows())
		{
			cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n";
			return;
		} 
		for(ir=0; ir<r; ir++) {
			int64_t icolmin = fIA[ir];
			int64_t icolmax = fIA[ir+1];
			const TVar *xptr = &(x.g(0,0));
			TVar *Aptr = &fA[0];
			int64_t *JAptr = &fJA[0];
			for(sum = 0.0, icol=icolmin; icol<icolmax; icol++ ) {
				sum += Aptr[icol] * xptr[JAptr[icol]];
			}
			z(ir,0) += alpha * sum;
		}
	}
	else 
	{
		for(ic=0; ic<xcols; ic++) {
			if(opt == 0) {
				
				for(ir=0; ir<this->Rows(); ir++) {
					for(sum = 0.0, icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						sum += fA[icol] * x.g((fJA[icol]),ic);
					}
					z(ir,ic) += alpha * sum;
				}
			}
			
			// Compute alpha * A^T * x
			else 
			{
				if (this->Rows() != x.Rows() || this->Cols() != y.Rows())
				{
					cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n";
					return; 
				}
				int64_t jc;
				int64_t icol;
				for(ir=0; ir<this->Rows(); ir++) {
					for(icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						if(fJA[icol]==-1) break; //Checa a exist�cia de dado ou n�
						jc = fJA[icol];
						TVar aval = fA[icol];
						//cout << "FA["<<icol<<"] = "<<aval<< " * x["<< ir<<"] ="<< x.Get(ir,ic)<< endl;
						z(jc,ic) += alpha * aval * x.g(ir,ic);
					}
				}
			}
		}
	}
}